

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::AddDefaultGenerators(cmake *this)

{
  pointer *pppcVar1;
  iterator iVar2;
  cmGlobalGeneratorFactory *local_10;
  
  local_10 = (cmGlobalGeneratorFactory *)operator_new(8);
  local_10->_vptr_cmGlobalGeneratorFactory = (_func_int **)&PTR__cmGlobalGeneratorFactory_006d5780;
  iVar2._M_current =
       (this->Generators).
       super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->Generators).
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>>::
    _M_realloc_insert<cmGlobalGeneratorFactory*>
              ((vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>> *)this,
               iVar2,&local_10);
  }
  else {
    *iVar2._M_current = local_10;
    pppcVar1 = &(this->Generators).
                super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_10 = (cmGlobalGeneratorFactory *)operator_new(8);
  local_10->_vptr_cmGlobalGeneratorFactory = (_func_int **)&PTR__cmGlobalGeneratorFactory_006d57e8;
  iVar2._M_current =
       (this->Generators).
       super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->Generators).
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>>::
    _M_realloc_insert<cmGlobalGeneratorFactory*>
              ((vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>> *)this,
               iVar2,&local_10);
  }
  else {
    *iVar2._M_current = local_10;
    pppcVar1 = &(this->Generators).
                super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_10 = (cmGlobalGeneratorFactory *)operator_new(8);
  local_10->_vptr_cmGlobalGeneratorFactory = (_func_int **)&PTR__cmGlobalGeneratorFactory_006d5840;
  iVar2._M_current =
       (this->Generators).
       super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->Generators).
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>>::
    _M_realloc_insert<cmGlobalGeneratorFactory*>
              ((vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>> *)this,
               iVar2,&local_10);
  }
  else {
    *iVar2._M_current = local_10;
    pppcVar1 = &(this->Generators).
                super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return;
}

Assistant:

void cmake::AddDefaultGenerators()
{
#if defined(_WIN32) && !defined(__CYGWIN__)
# if !defined(CMAKE_BOOT_MINGW)
  this->Generators.push_back(
    cmGlobalVisualStudio14Generator::NewFactory());
  this->Generators.push_back(
    cmGlobalVisualStudio12Generator::NewFactory());
  this->Generators.push_back(
    cmGlobalVisualStudio11Generator::NewFactory());
  this->Generators.push_back(
    cmGlobalVisualStudio10Generator::NewFactory());
  this->Generators.push_back(
    cmGlobalVisualStudio9Generator::NewFactory());
  this->Generators.push_back(
    cmGlobalVisualStudio8Generator::NewFactory());
  this->Generators.push_back(
    cmGlobalVisualStudio71Generator::NewFactory());
  this->Generators.push_back(
    cmGlobalVisualStudio7Generator::NewFactory());
  this->Generators.push_back(
    cmGlobalVisualStudio6Generator::NewFactory());
  this->Generators.push_back(
    cmGlobalBorlandMakefileGenerator::NewFactory());
  this->Generators.push_back(
    cmGlobalNMakeMakefileGenerator::NewFactory());
  this->Generators.push_back(
    cmGlobalJOMMakefileGenerator::NewFactory());
  this->Generators.push_back(
    cmGlobalGhsMultiGenerator::NewFactory());
# endif
  this->Generators.push_back(
    cmGlobalMSYSMakefileGenerator::NewFactory());
  this->Generators.push_back(
    cmGlobalMinGWMakefileGenerator::NewFactory());
#endif
  this->Generators.push_back(
    cmGlobalUnixMakefileGenerator3::NewFactory());
#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->Generators.push_back(
    cmGlobalNinjaGenerator::NewFactory());
#endif
#if defined(CMAKE_USE_WMAKE)
  this->Generators.push_back(
    cmGlobalWatcomWMakeGenerator::NewFactory());
#endif
#ifdef CMAKE_USE_XCODE
  this->Generators.push_back(
    cmGlobalXCodeGenerator::NewFactory());
#endif
}